

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UVector * icu_63::TimeZoneFormat::parseOffsetPattern
                    (UnicodeString *pattern,OffsetFields required,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  bool bVar3;
  char16_t ch_00;
  int32_t iVar4;
  FieldType FVar5;
  UnicodeString *this;
  GMTOffsetField *pGVar6;
  undefined4 in_register_00000034;
  size_t size;
  UnicodeString *local_130;
  FieldType local_124;
  int32_t reqBits;
  GMTOffsetField *fld_3;
  GMTOffsetField *tfld;
  GMTOffsetField *fld_2;
  GMTOffsetField *fld_1;
  GMTOffsetField *textfld;
  FieldType tmpType;
  GMTOffsetField *fld;
  uint8_t uStack_e0;
  UChar ch;
  int32_t i;
  int32_t itemLength;
  FieldType itemType;
  UnicodeString text;
  UChar textBuf [32];
  FieldType local_50;
  UBool inQuote;
  UBool isPrevQuote;
  int32_t checkBits;
  UVector *result;
  UErrorCode *status_local;
  OffsetFields required_local;
  UnicodeString *pattern_local;
  
  size = CONCAT44(in_register_00000034,required);
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 != '\0') {
    return (UVector *)0x0;
  }
  this = (UnicodeString *)UMemory::operator_new((UMemory *)0x28,size);
  local_130 = (UnicodeString *)0x0;
  if (this != (UnicodeString *)0x0) {
    UVector::UVector((UVector *)this,deleteGMTOffsetField,(UElementsAreEqual *)0x0,status);
    local_130 = this;
  }
  if (local_130 == (UnicodeString *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return (UVector *)0x0;
  }
  local_50 = TEXT;
  bVar1 = false;
  bVar3 = false;
  UnicodeString::UnicodeString
            ((UnicodeString *)&itemLength,text.fUnion.fStackFields.fBuffer + 0x17,0,0x20);
  i = 0;
  _uStack_e0 = 1;
  fld._4_4_ = 0;
  while( true ) {
    iVar4 = UnicodeString::length(pattern);
    if (iVar4 <= fld._4_4_) break;
    ch_00 = UnicodeString::charAt(pattern,fld._4_4_);
    if (ch_00 == L'\'') {
      if (bVar1) {
        UnicodeString::append((UnicodeString *)&itemLength,L'\'');
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if (i != 0) {
          UVar2 = GMTOffsetField::isValid(i,_uStack_e0);
          if (UVar2 == '\0') {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            break;
          }
          pGVar6 = GMTOffsetField::createTimeField(i,uStack_e0,status);
          UVector::addElement((UVector *)local_130,pGVar6,status);
          UVar2 = ::U_FAILURE(*status);
          if (UVar2 != '\0') break;
          i = 0;
        }
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else {
      bVar1 = false;
      if (bVar3) {
        UnicodeString::append((UnicodeString *)&itemLength,ch_00);
      }
      else {
        FVar5 = GMTOffsetField::getTypeByLetter(ch_00);
        if (FVar5 == TEXT) {
          if (i != 0) {
            UVar2 = GMTOffsetField::isValid(i,_uStack_e0);
            if (UVar2 == '\0') {
              *status = U_ILLEGAL_ARGUMENT_ERROR;
              break;
            }
            pGVar6 = GMTOffsetField::createTimeField(i,uStack_e0,status);
            UVector::addElement((UVector *)local_130,pGVar6,status);
            UVar2 = ::U_FAILURE(*status);
            if (UVar2 != '\0') break;
            i = 0;
          }
          UnicodeString::append((UnicodeString *)&itemLength,ch_00);
        }
        else if (FVar5 == i) {
          _uStack_e0 = _uStack_e0 + 1;
        }
        else {
          if (i == 0) {
            iVar4 = UnicodeString::length((UnicodeString *)&itemLength);
            if (0 < iVar4) {
              pGVar6 = GMTOffsetField::createText((UnicodeString *)&itemLength,status);
              UVector::addElement((UVector *)local_130,pGVar6,status);
              UVar2 = ::U_FAILURE(*status);
              if (UVar2 != '\0') break;
              UnicodeString::remove((UnicodeString *)&itemLength,(char *)pGVar6);
            }
          }
          else {
            UVar2 = GMTOffsetField::isValid(i,_uStack_e0);
            if (UVar2 == '\0') {
              *status = U_ILLEGAL_ARGUMENT_ERROR;
              break;
            }
            pGVar6 = GMTOffsetField::createTimeField(i,uStack_e0,status);
            UVector::addElement((UVector *)local_130,pGVar6,status);
            UVar2 = ::U_FAILURE(*status);
            if (UVar2 != '\0') break;
          }
          _uStack_e0 = 1;
          local_50 = FVar5 | local_50;
          i = FVar5;
        }
      }
    }
    fld._4_4_ = fld._4_4_ + 1;
  }
  UVar2 = ::U_SUCCESS(*status);
  if (UVar2 != '\0') {
    if (i == 0) {
      iVar4 = UnicodeString::length((UnicodeString *)&itemLength);
      if (0 < iVar4) {
        pGVar6 = GMTOffsetField::createText((UnicodeString *)&itemLength,status);
        UVector::addElement((UVector *)local_130,pGVar6,status);
      }
    }
    else {
      UVar2 = GMTOffsetField::isValid(i,_uStack_e0);
      if (UVar2 == '\0') {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        pGVar6 = GMTOffsetField::createTimeField(i,uStack_e0,status);
        UVector::addElement((UVector *)local_130,pGVar6,status);
      }
    }
    UVar2 = ::U_SUCCESS(*status);
    if (UVar2 != '\0') {
      local_124 = TEXT;
      if (required == FIELDS_H) {
        local_124 = HOUR;
      }
      else if (required == FIELDS_HM) {
        local_124 = MINUTE|HOUR;
      }
      else if (required == FIELDS_HMS) {
        local_124 = SECOND|MINUTE|HOUR;
      }
      if (local_50 == local_124) {
        pattern_local = local_130;
        goto LAB_0023f62c;
      }
    }
  }
  if (local_130 != (UnicodeString *)0x0) {
    (*(local_130->super_Replaceable).super_UObject._vptr_UObject[1])();
  }
  pattern_local = (UnicodeString *)0x0;
LAB_0023f62c:
  UnicodeString::~UnicodeString((UnicodeString *)&itemLength);
  return (UVector *)pattern_local;
}

Assistant:

UVector*
TimeZoneFormat::parseOffsetPattern(const UnicodeString& pattern, OffsetFields required, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    UVector* result = new UVector(deleteGMTOffsetField, NULL, status);
    if (result == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }

    int32_t checkBits = 0;
    UBool isPrevQuote = FALSE;
    UBool inQuote = FALSE;
    UChar textBuf[32];
    UnicodeString text(textBuf, 0, UPRV_LENGTHOF(textBuf));
    GMTOffsetField::FieldType itemType = GMTOffsetField::TEXT;
    int32_t itemLength = 1;

    for (int32_t i = 0; i < pattern.length(); i++) {
        UChar ch = pattern.charAt(i);
        if (ch == SINGLEQUOTE) {
            if (isPrevQuote) {
                text.append(SINGLEQUOTE);
                isPrevQuote = FALSE;
            } else {
                isPrevQuote = TRUE;
                if (itemType != GMTOffsetField::TEXT) {
                    if (GMTOffsetField::isValid(itemType, itemLength)) {
                        GMTOffsetField* fld = GMTOffsetField::createTimeField(itemType, static_cast<uint8_t>(itemLength), status);
                        result->addElement(fld, status);
                        if (U_FAILURE(status)) {
                            break;
                        }
                    } else {
                        status = U_ILLEGAL_ARGUMENT_ERROR;
                        break;
                    }
                    itemType = GMTOffsetField::TEXT;
                }
            }
            inQuote = !inQuote;
        } else {
            isPrevQuote = FALSE;
            if (inQuote) {
                text.append(ch);
            } else {
                GMTOffsetField::FieldType tmpType = GMTOffsetField::getTypeByLetter(ch);
                if (tmpType != GMTOffsetField::TEXT) {
                    // an offset time pattern character
                    if (tmpType == itemType) {
                        itemLength++;
                    } else {
                        if (itemType == GMTOffsetField::TEXT) {
                            if (text.length() > 0) {
                                GMTOffsetField* textfld = GMTOffsetField::createText(text, status);
                                result->addElement(textfld, status);
                                if (U_FAILURE(status)) {
                                    break;
                                }
                                text.remove();
                            }
                        } else {
                            if (GMTOffsetField::isValid(itemType, itemLength)) {
                                GMTOffsetField* fld = GMTOffsetField::createTimeField(itemType, static_cast<uint8_t>(itemLength), status);
                                result->addElement(fld, status);
                                if (U_FAILURE(status)) {
                                    break;
                                }
                            } else {
                                status = U_ILLEGAL_ARGUMENT_ERROR;
                                break;
                            }
                        }
                        itemType = tmpType;
                        itemLength = 1;
                        checkBits |= tmpType;
                    }
                } else {
                    // a string literal
                    if (itemType != GMTOffsetField::TEXT) {
                        if (GMTOffsetField::isValid(itemType, itemLength)) {
                            GMTOffsetField* fld = GMTOffsetField::createTimeField(itemType, static_cast<uint8_t>(itemLength), status);
                            result->addElement(fld, status);
                            if (U_FAILURE(status)) {
                                break;
                            }
                        } else {
                            status = U_ILLEGAL_ARGUMENT_ERROR;
                            break;
                        }
                        itemType = GMTOffsetField::TEXT;
                    }
                    text.append(ch);
                }
            }
        }
    }
    // handle last item
    if (U_SUCCESS(status)) {
        if (itemType == GMTOffsetField::TEXT) {
            if (text.length() > 0) {
                GMTOffsetField* tfld = GMTOffsetField::createText(text, status);
                result->addElement(tfld, status);
            }
        } else {
            if (GMTOffsetField::isValid(itemType, itemLength)) {
                GMTOffsetField* fld = GMTOffsetField::createTimeField(itemType, static_cast<uint8_t>(itemLength), status);
                result->addElement(fld, status);
            } else {
                status = U_ILLEGAL_ARGUMENT_ERROR;
            }
        }

        // Check all required fields are set
        if (U_SUCCESS(status)) {
            int32_t reqBits = 0;
            switch (required) {
            case FIELDS_H:
                reqBits = GMTOffsetField::HOUR;
                break;
            case FIELDS_HM:
                reqBits = GMTOffsetField::HOUR | GMTOffsetField::MINUTE;
                break;
            case FIELDS_HMS:
                reqBits = GMTOffsetField::HOUR | GMTOffsetField::MINUTE | GMTOffsetField::SECOND;
                break;
            }
            if (checkBits == reqBits) {
                // all required fields are set, no extra fields
                return result;
            }
        }
    }

    // error
    delete result;
    return NULL;
}